

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

type * __thiscall
linalg::detail::apply<linalg::detail::op_div,void,linalg::mat<double,3,3>,double>::impl<0,1,2>
          (undefined8 param_1,mat<double,_3,_3> *__return_storage_ptr__,
          apply<linalg::detail::op_div,void,linalg::mat<double,3,3>,double> *this)

{
  getter<2> local_d9;
  V local_d8;
  V local_b8;
  getter<1> local_99;
  V local_98;
  V local_78;
  getter<0> local_59;
  V local_58;
  V local_38;
  undefined8 local_20;
  double b_local;
  mat<double,_3,_3> *a_local;
  
  local_20 = param_1;
  b_local = (double)this;
  getter<0>::operator()(&local_58,&local_59,(mat<double,_3,_3> *)this);
  apply<linalg::detail::op_div,void,linalg::vec<double,3>,double>::impl<0,1,2>
            (local_20,(apply<linalg::detail::op_div,void,linalg::vec<double,3>,double> *)&local_38,
             &local_58);
  getter<1>::operator()(&local_98,&local_99,(mat<double,_3,_3> *)b_local);
  apply<linalg::detail::op_div,void,linalg::vec<double,3>,double>::impl<0,1,2>
            (local_20,(apply<linalg::detail::op_div,void,linalg::vec<double,3>,double> *)&local_78,
             &local_98);
  getter<2>::operator()(&local_d8,&local_d9,(mat<double,_3,_3> *)b_local);
  apply<linalg::detail::op_div,void,linalg::vec<double,3>,double>::impl<0,1,2>
            (local_20,(apply<linalg::detail::op_div,void,linalg::vec<double,3>,double> *)&local_b8,
             &local_d8);
  mat<double,_3,_3>::mat(__return_storage_ptr__,&local_38,&local_78,&local_b8);
  return __return_storage_ptr__;
}

Assistant:

static constexpr type impl(seq<J...>, F f, const mat<A,M,N> & a, B                  b) { return {apply<F, void, vec<A,M>, B       >::impl(make_seq<0,M>{}, f, getter<J>{}(a), b             )...}; }